

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O2

void displayMenu(void)

{
  int iVar1;
  
  pCenter(1,"ZVGTWEAK UTILITY VERSION 0.9");
  iVar1 = wmove(_stdscr,0xf,1);
  if (iVar1 != -1) {
    waddnstr(_stdscr,"Commands:",0xffffffffffffffff);
  }
  iVar1 = wmove(_stdscr,0x10,3);
  if (iVar1 != -1) {
    waddnstr(_stdscr,"Up/Down-Select a parameter.            Left/Right-Update a parameter.",
             0xffffffffffffffff);
  }
  iVar1 = wmove(_stdscr,0x11,3);
  if (iVar1 != -1) {
    waddnstr(_stdscr,"I-Initialize ZVG to factory settings.  X-Exit to DOS (or use ESC).",
             0xffffffffffffffff);
  }
  iVar1 = wmove(_stdscr,0x12,3);
  if (iVar1 != -1) {
    waddnstr(_stdscr,"L-Load values from EEPROM.             S-Save values to EEPROM.",
             0xffffffffffffffff);
  }
  pCenter(0x15,"(c) Copyright 2003, Zektor, LLC.  All rights reserved.");
  return;
}

Assistant:

void displayMenu( void)
{
	pCenter( 1, "ZVGTWEAK UTILITY VERSION 0.9");

#if defined(WIN32)
#elif defined(linux)

	mvaddstr( 15, 1, "Commands:");
	mvaddstr( 16, 3, "Up/Down-Select a parameter.            "
					 "Left/Right-Update a parameter.");
	mvaddstr( 17, 3, "I-Initialize ZVG to factory settings.  "
					 "X-Exit to DOS (or use ESC).");
	mvaddstr( 18, 3, "L-Load values from EEPROM.             "
					 "S-Save values to EEPROM.");

#else // DOS

	gotoxy( 1, 15);
	cputs( "Commands:\r\n");
	cputs( " Up/Down-Select a parameter.            Left/Right-Update a parameter.\r\n");
	cputs( " I-Initialize ZVG to factory settings.  X-Exit to DOS (or use ESC).\r\n");
	cputs( " L-Load values from EEPROM.             S-Save values to EEPROM.\r\n");
//	cputs( " R-Read values from a config file.      W-Write values to a config file.\r\n");

#endif // OS

	pCenter( 21, "(c) Copyright 2003, Zektor, LLC.  All rights reserved.");
}